

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::Reader::decodeNumber(Reader *this,Token *token,Value *decoded)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  byte *pbVar6;
  ulong value;
  ulong uVar7;
  Value local_58;
  
  cVar1 = *token->start_;
  uVar7 = -(ulong)(cVar1 != '-') | 0x8000000000000000;
  pbVar6 = (byte *)(token->start_ + (cVar1 == '-'));
  bVar4 = false;
  value = 0;
  while (pbVar6 < token->end_) {
    bVar2 = *pbVar6;
    pbVar6 = pbVar6 + 1;
    if (((byte)(bVar2 - 0x3a) < 0xf6) ||
       ((uVar5 = (ulong)(bVar2 - 0x30), uVar7 / 10 <= value &&
        (((uVar7 / 10 < value || (pbVar6 != (byte *)token->end_)) || (uVar7 % 10 < uVar5)))))) {
      bVar4 = decodeDouble(this,token,decoded);
      bVar3 = false;
    }
    else {
      value = uVar5 + value * 10;
      bVar3 = true;
    }
    if (!bVar3) {
      return bVar4;
    }
  }
  if ((cVar1 == '-') && (value == uVar7)) {
    value = 0x8000000000000000;
  }
  else if (cVar1 == '-') {
    value = -value;
  }
  else if (0x7fffffff < value) {
    Value::Value(&local_58,value);
    goto LAB_00129240;
  }
  Value::Value(&local_58,value);
LAB_00129240:
  Value::operator=(decoded,&local_58);
  Value::~Value(&local_58);
  return true;
}

Assistant:

bool Reader::decodeNumber(Token& token, Value& decoded) {
  // Attempts to parse the number as an integer. If the number is
  // larger than the maximum supported value of an integer then
  // we decode the number as a double.
  Location current = token.start_;
  bool isNegative = *current == '-';
  if (isNegative)
    ++current;
  // TODO: Help the compiler do the div and mod at compile time or get rid of
  // them.
  Value::LargestUInt maxIntegerValue =
      isNegative ? Value::LargestUInt(Value::maxLargestInt) + 1
                 : Value::maxLargestUInt;
  Value::LargestUInt threshold = maxIntegerValue / 10;
  Value::LargestUInt value = 0;
  while (current < token.end_) {
    Char c = *current++;
    if (c < '0' || c > '9')
      return decodeDouble(token, decoded);
    auto digit(static_cast<Value::UInt>(c - '0'));
    if (value >= threshold) {
      // We've hit or exceeded the max value divided by 10 (rounded down). If
      // a) we've only just touched the limit, b) this is the last digit, and
      // c) it's small enough to fit in that rounding delta, we're okay.
      // Otherwise treat this number as a double to avoid overflow.
      if (value > threshold || current != token.end_ ||
          digit > maxIntegerValue % 10) {
        return decodeDouble(token, decoded);
      }
    }
    value = value * 10 + digit;
  }
  if (isNegative && value == maxIntegerValue)
    decoded = Value::minLargestInt;
  else if (isNegative)
    decoded = -Value::LargestInt(value);
  else if (value <= Value::LargestUInt(Value::maxInt))
    decoded = Value::LargestInt(value);
  else
    decoded = value;
  return true;
}